

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_FreeTiming(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  void **__ptr;
  void *pArray;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  while (iVar2 = Vec_PtrSize(pManMR->vExactNodes), iVar2 != 0) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrPop(pManMR->vExactNodes);
    pVVar1 = pManMR->vTimeEdges;
    uVar3 = Abc_ObjId(pObj_00);
    iVar2 = Vec_PtrSize(pVVar1 + uVar3);
    if (iVar2 != 0) {
      pVVar1 = pManMR->vTimeEdges;
      uVar3 = Abc_ObjId(pObj_00);
      __ptr = Vec_PtrReleaseArray(pVVar1 + uVar3);
      if (__ptr != (void **)0x0) {
        free(__ptr);
      }
    }
  }
  Vec_PtrFree(pManMR->vExactNodes);
  if (pManMR->vTimeEdges != (Vec_Ptr_t *)0x0) {
    free(pManMR->vTimeEdges);
    pManMR->vTimeEdges = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FlowRetime_FreeTiming( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj;
  void *pArray;

  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

  Vec_PtrFree(pManMR->vExactNodes);
  ABC_FREE( pManMR->vTimeEdges );
}